

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionFail_x_iutest_x_Comparison_Test::Body
          (iu_ExpressionFail_x_iutest_x_Comparison_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  char *in_R9;
  ScopedSPITestFlag guard;
  uint local_280 [2];
  undefined1 local_278 [40];
  iuCodeMessage local_250;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_278,(int *)(local_280 + 1));
  local_280[0] = 0x29;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_250,(ExpressionLHS<int> *)local_278,(int *)local_280);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() == 41))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x98,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 == 41",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x98,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_278,(int *)(local_280 + 1));
  local_280[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)&local_250,(ExpressionLHS<int> *)local_278,(int *)local_280);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x99,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 != 42",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x99,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_278,(int *)(local_280 + 1));
  local_280[0] = 0x29;
  iutest::detail::ExpressionLHS<int>::operator<
            ((ExpressionResult *)&local_250,(ExpressionLHS<int> *)local_278,(int *)local_280);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() < 41))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9a,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 < 41",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9a,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_278,(int *)(local_280 + 1));
  local_280[0] = 0x29;
  iutest::detail::ExpressionLHS<int>::operator<=
            ((ExpressionResult *)&local_250,(ExpressionLHS<int> *)local_278,(int *)local_280);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() <= 41))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9b,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 <= 41",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9b,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_278,(int *)(local_280 + 1));
  local_280[0] = 0x2b;
  iutest::detail::ExpressionLHS<int>::operator>
            ((ExpressionResult *)&local_250,(ExpressionLHS<int> *)local_278,(int *)local_280);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() > 43))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9c,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 > 43",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_278,(int *)(local_280 + 1));
  local_280[0] = 0x2b;
  iutest::detail::ExpressionLHS<int>::operator>=
            ((ExpressionResult *)&local_250,(ExpressionLHS<int> *)local_278,(int *)local_280);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() >= 43))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9d,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 >= 43",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[0] = local_280[0] & 0xffffff00;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)local_278,(bool *)local_280);
  local_280[1] = 0;
  iutest::detail::ExpressionLHS<bool>::operator&&
            ((ExpressionResult *)&local_250,(ExpressionLHS<bool> *)local_278,(int *)(local_280 + 1))
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((g() && 0))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9e,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: false && 0",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_280[0] = local_280[0] & 0xffffff00;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)local_278,(bool *)local_280);
  local_280[1] = 0;
  iutest::detail::ExpressionLHS<bool>::operator||
            ((ExpressionResult *)&local_250,(ExpressionLHS<bool> *)local_278,(int *)(local_280 + 1))
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_250,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((g() || 0))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9f,(char *)local_278._0_8_);
    local_250._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_278);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: false || 0",(allocator<char> *)&local_250);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(ExpressionFail, Comparison)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() == 41), "expansion: 42 == 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() != 42), "expansion: 42 != 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <  41), "expansion: 42 < 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <= 41), "expansion: 42 <= 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >  43), "expansion: 42 > 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >= 43), "expansion: 42 >= 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() &&  0), "expansion: false && 0");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() ||  0), "expansion: false || 0");
}